

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O3

QDebug operator<<(QDebug stream,QFont *font)

{
  int iVar1;
  QArrayData *pQVar2;
  long lVar3;
  QArrayData *pQVar4;
  storage_type_conflict *psVar5;
  long lVar6;
  double dVar7;
  QDebug QVar8;
  char cVar9;
  QFontPrivate *pQVar10;
  QFont *in_RDX;
  QMetaObject *pQVar11;
  char16_t *pcVar12;
  char *pcVar13;
  QDebug *this;
  QDebug *this_00;
  int property;
  uint uVar14;
  long in_FS_OFFSET;
  bool bVar15;
  double dVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QStringView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QStringView QVar32;
  QDebugStateSaver saver_1;
  QDebug debug;
  QDebugStateSaver saver;
  QDebug local_128;
  QDebug local_120;
  QDebug local_118;
  QDebug local_110;
  QDebug local_108;
  QDebug local_100;
  QDebug local_f8;
  QDebug local_f0;
  QDebug local_e8;
  QDebug local_e0;
  QDebug local_d8;
  QDebug local_d0;
  QDebug local_c8;
  QDebug local_c0;
  QDebug local_b8;
  QDebug local_b0;
  QDebug local_a8;
  QDebug local_a0;
  undefined1 *local_98;
  QDebug local_90;
  QString local_88;
  undefined1 *local_68;
  QArrayData *local_60 [3];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_68,(QDebug *)font);
  pQVar10 = (font->d).d.ptr;
  *(undefined2 *)&(pQVar10->request).styleName.d.size = 0x100;
  QVar17.m_data = &DAT_00000006;
  QVar17.m_size = (qsizetype)local_60;
  QString::fromUtf8(QVar17);
  QTextStream::operator<<((QTextStream *)pQVar10,(QString *)local_60);
  if (local_60[0] != (QArrayData *)0x0) {
    LOCK();
    (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_60[0],2,0x10);
    }
  }
  pQVar10 = (font->d).d.ptr;
  if ((char)(pQVar10->request).styleName.d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar10,' ');
    pQVar10 = (font->d).d.ptr;
  }
  if (*(int *)((long)&(pQVar10->request).styleName.d.size + 4) == 2) {
    QFont::toString(&local_88,in_RDX);
    pcVar12 = local_88.d.ptr;
    if (local_88.d.ptr == (char16_t *)0x0) {
      pcVar12 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)font,(ulong)pcVar12);
    pQVar10 = (font->d).d.ptr;
    if ((char)(pQVar10->request).styleName.d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar10,' ');
      pQVar10 = (font->d).d.ptr;
    }
    QVar18.m_data = (storage_type *)0x1;
    QVar18.m_size = (qsizetype)local_60;
    QString::fromUtf8(QVar18);
    QTextStream::operator<<((QTextStream *)pQVar10,(QString *)local_60);
    if (local_60[0] != (QArrayData *)0x0) {
      LOCK();
      (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60[0],2,0x10);
      }
    }
    pQVar10 = (font->d).d.ptr;
    if ((char)(pQVar10->request).styleName.d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar10,' ');
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar10 = (font->d).d.ptr;
    (font->d).d.ptr = (QFontPrivate *)0x0;
    *(QFontPrivate **)stream.stream = pQVar10;
  }
  else {
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (char16_t *)0x0;
    local_88.d.size = 0;
    local_90.stream = (Stream *)&DAT_aaaaaaaaaaaaaaaa;
    QDebug::QDebug(&local_90,&local_88);
    (local_90.stream)->space = false;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar10 = (QFontPrivate *)operator_new(0x98);
    QFontPrivate::QFontPrivate(pQVar10);
    QFont::QFont((QFont *)local_48,pQVar10);
    uVar14 = 2;
    do {
      if (((in_RDX->resolve_mask & uVar14) != 0) ||
         (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 0)) {
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_98,(QDebug *)&local_90);
        QVar8.stream = local_90.stream;
        if ((int)uVar14 < 0x100) {
          if ((int)uVar14 < 0x10) {
            if (uVar14 != 2) {
              if (uVar14 == 4) {
                pQVar10 = (in_RDX->d).d.ptr;
                if (((char)((ulong)*(undefined8 *)(local_48._0_8_ + 0x68) >> 0x20) !=
                     (char)((ulong)*(undefined8 *)&(pQVar10->request).field_0x60 >> 0x20)) ||
                   (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
                  (local_90.stream)->verbosity = 1;
                  local_a8.stream = local_90.stream;
                  (local_90.stream)->ref = (local_90.stream)->ref + 1;
                  this_00 = &local_a8;
                  qt_QMetaEnum_debugOperator
                            ((QDebug *)&local_a0,(longlong)this_00,
                             (QMetaObject *)(ulong)(byte)(pQVar10->request).field_0x64,
                             (char *)&QFont::staticMetaObject);
                  QDebug::~QDebug(&local_a0);
                  goto LAB_00486707;
                }
              }
              else if ((uVar14 == 8) &&
                      ((pQVar10 = (in_RDX->d).d.ptr,
                       (short)*(undefined4 *)&(pQVar10->request).field_0x60 !=
                       (short)*(undefined4 *)(local_48._0_8_ + 0x68) ||
                       (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1))))
              {
                (local_90.stream)->verbosity = 1;
                local_b8.stream = local_90.stream;
                (local_90.stream)->ref = (local_90.stream)->ref + 1;
                pQVar11 = (QMetaObject *)(ulong)*(ushort *)&(pQVar10->request).field_0x60;
                this = &local_b0;
                this_00 = &local_b8;
                goto LAB_004866f7;
              }
              goto LAB_00486a0f;
            }
            pQVar10 = (in_RDX->d).d.ptr;
            dVar7 = (pQVar10->request).pointSize;
            if (0.0 <= dVar7) {
              QTextStream::operator<<(&(local_90.stream)->ts,dVar7);
              if ((local_90.stream)->space == true) {
                QTextStream::operator<<(&(local_90.stream)->ts,' ');
              }
            }
            else {
              QTextStream::operator<<(&(local_90.stream)->ts,(int)(pQVar10->request).pixelSize);
              if ((local_90.stream)->space == true) {
                QTextStream::operator<<(&(local_90.stream)->ts,' ');
              }
            }
            QVar8.stream = local_90.stream;
            QVar29.m_data = (storage_type *)0x2;
            QVar29.m_size = (qsizetype)local_60;
            QString::fromUtf8(QVar29);
            QTextStream::operator<<(&(QVar8.stream)->ts,(QString *)local_60);
            if (local_60[0] != (QArrayData *)0x0) {
              LOCK();
              (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_60[0],2,0x10);
              }
            }
LAB_00486988:
            if ((local_90.stream)->space == true) {
              QTextStream::operator<<(&(local_90.stream)->ts,' ');
            }
          }
          else {
            if (0x3f < (int)uVar14) {
              if (uVar14 == 0x40) {
                if ((((((in_RDX->d).d.ptr)->field_0x7c ^ *(byte *)(local_48._0_8_ + 0x7c)) & 1) != 0
                    ) || (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1))
                {
                  QVar26.m_data = (storage_type *)0xa;
                  QVar26.m_size = (qsizetype)local_60;
                  QString::fromUtf8(QVar26);
                  QTextStream::operator<<(&(QVar8.stream)->ts,(QString *)local_60);
                  if (local_60[0] != (QArrayData *)0x0) {
                    LOCK();
                    (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_60[0],2,0x10);
                    }
                  }
                  if ((local_90.stream)->space == true) {
                    QTextStream::operator<<(&(local_90.stream)->ts,' ');
                  }
                  bVar15 = (((in_RDX->d).d.ptr)->field_0x7c & 1) == 0;
                  goto LAB_00486971;
                }
              }
              else if ((uVar14 == 0x80) &&
                      ((((((in_RDX->d).d.ptr)->field_0x7c ^ *(byte *)(local_48._0_8_ + 0x7c)) & 2)
                        != 0 || (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4)
                                 != 1)))) {
                QVar23.m_data = (storage_type *)0x9;
                QVar23.m_size = (qsizetype)local_60;
                QString::fromUtf8(QVar23);
                QTextStream::operator<<(&(QVar8.stream)->ts,(QString *)local_60);
                if (local_60[0] != (QArrayData *)0x0) {
                  LOCK();
                  (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_60[0],2,0x10);
                  }
                }
                if ((local_90.stream)->space == true) {
                  QTextStream::operator<<(&(local_90.stream)->ts,' ');
                }
                bVar15 = (((in_RDX->d).d.ptr)->field_0x7c & 2) == 0;
                goto LAB_00486971;
              }
              goto LAB_00486a0f;
            }
            if (uVar14 == 0x10) {
              (local_90.stream)->verbosity = 1;
              local_c8.stream = local_90.stream;
              (local_90.stream)->ref = (local_90.stream)->ref + 1;
              pQVar11 = (QMetaObject *)
                        (ulong)((uint)((ulong)*(undefined8 *)
                                               &(((in_RDX->d).d.ptr)->request).field_0x60 >> 0x28) &
                               0x3ff);
              this = &local_c0;
              this_00 = &local_c8;
            }
            else {
              if ((uVar14 != 0x20) ||
                 ((pQVar10 = (in_RDX->d).d.ptr,
                  ((*(uint *)(local_48._0_8_ + 0x68) ^ *(uint *)&(pQVar10->request).field_0x60) &
                  0x30000000) == 0 &&
                  (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) == 1))))
              goto LAB_00486a0f;
              (local_90.stream)->verbosity = 0;
              local_d8.stream = local_90.stream;
              (local_90.stream)->ref = (local_90.stream)->ref + 1;
              pQVar11 = (QMetaObject *)(ulong)(*(uint *)&(pQVar10->request).field_0x60 >> 0x1c & 3);
              this = &local_d0;
              this_00 = &local_d8;
            }
LAB_004866f7:
            qt_QMetaEnum_debugOperator
                      ((QDebug *)this,(longlong)this_00,pQVar11,(char *)&QFont::staticMetaObject);
            QDebug::~QDebug(this);
LAB_00486707:
            QDebug::~QDebug(this_00);
          }
LAB_004869a0:
          QVar8.stream = local_90.stream;
          QVar30.m_data = (storage_type *)0x2;
          QVar30.m_size = (qsizetype)local_60;
          QString::fromUtf8(QVar30);
          QTextStream::operator<<(&(QVar8.stream)->ts,(QString *)local_60);
          if (local_60[0] != (QArrayData *)0x0) {
            LOCK();
            (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_60[0],2,0x10);
            }
          }
          if ((local_90.stream)->space == true) {
            QTextStream::operator<<(&(local_90.stream)->ts,' ');
          }
        }
        else if ((int)uVar14 < 0x1000) {
          if ((int)uVar14 < 0x400) {
            if (uVar14 == 0x100) {
              if ((((((in_RDX->d).d.ptr)->field_0x7c ^ *(byte *)(local_48._0_8_ + 0x7c)) & 4) != 0)
                 || (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
                QVar27.m_data = (storage_type *)0xa;
                QVar27.m_size = (qsizetype)local_60;
                QString::fromUtf8(QVar27);
                QTextStream::operator<<(&(QVar8.stream)->ts,(QString *)local_60);
                if (local_60[0] != (QArrayData *)0x0) {
                  LOCK();
                  (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_60[0],2,0x10);
                  }
                }
                if ((local_90.stream)->space == true) {
                  QTextStream::operator<<(&(local_90.stream)->ts,' ');
                }
                bVar15 = (((in_RDX->d).d.ptr)->field_0x7c & 4) == 0;
                goto LAB_00486971;
              }
            }
            else if ((uVar14 == 0x200) &&
                    ((((*(ulong *)(local_48._0_8_ + 0x68) & 0x4000000000000) != 0) !=
                      ((*(ulong *)&(((in_RDX->d).d.ptr)->request).field_0x60 & 0x4000000000000) != 0
                      ) || (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)
                     ))) {
              QVar19.m_data = (storage_type *)0xb;
              QVar19.m_size = (qsizetype)local_60;
              QString::fromUtf8(QVar19);
              QTextStream::operator<<(&(QVar8.stream)->ts,(QString *)local_60);
              if (local_60[0] != (QArrayData *)0x0) {
                LOCK();
                (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_60[0],2,0x10);
                }
              }
              if ((local_90.stream)->space == true) {
                QTextStream::operator<<(&(local_90.stream)->ts,' ');
              }
              bVar15 = (*(ulong *)&(((in_RDX->d).d.ptr)->request).field_0x60 & 0x4000000000000) == 0
              ;
LAB_00486971:
              pcVar13 = "true";
              if (bVar15) {
                pcVar13 = "false";
              }
              QTextStream::operator<<(&(local_90.stream)->ts,pcVar13);
              goto LAB_00486988;
            }
          }
          else if (uVar14 == 0x400) {
            pQVar10 = (in_RDX->d).d.ptr;
            if ((((*(uint *)(local_48._0_8_ + 0x68) ^ *(uint *)&(pQVar10->request).field_0x60) &
                 0xfff0000) != 0) ||
               (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
              (local_90.stream)->verbosity = 0;
              local_e8.stream = local_90.stream;
              (local_90.stream)->ref = (local_90.stream)->ref + 1;
              pQVar11 = (QMetaObject *)(ulong)(*(ushort *)&(pQVar10->request).field_0x62 & 0xfff);
              this = &local_e0;
              this_00 = &local_e8;
              goto LAB_004866f7;
            }
          }
          else if ((uVar14 == 0x800) &&
                  ((((((in_RDX->d).d.ptr)->field_0x7c ^ *(byte *)(local_48._0_8_ + 0x7c)) & 8) != 0
                   || (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)))) {
            QVar24.m_data = &DAT_00000008;
            QVar24.m_size = (qsizetype)local_60;
            QString::fromUtf8(QVar24);
            QTextStream::operator<<(&(QVar8.stream)->ts,(QString *)local_60);
            if (local_60[0] != (QArrayData *)0x0) {
              LOCK();
              (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_60[0],2,0x10);
              }
            }
            if ((local_90.stream)->space == true) {
              QTextStream::operator<<(&(local_90.stream)->ts,' ');
            }
            bVar15 = (((in_RDX->d).d.ptr)->field_0x7c & 8) == 0;
            goto LAB_00486971;
          }
        }
        else if ((int)uVar14 < 0x8000) {
          if (uVar14 == 0x1000) {
            pQVar10 = (in_RDX->d).d.ptr;
            if ((((*(byte *)(local_48._0_8_ + 0x7c) ^ pQVar10->field_0x7c) & 0x70) != 0) ||
               (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
              (local_90.stream)->verbosity = 0;
              local_f8.stream = local_90.stream;
              (local_90.stream)->ref = (local_90.stream)->ref + 1;
              pQVar11 = (QMetaObject *)(ulong)((byte)pQVar10->field_0x7c >> 4 & 7);
              this = &local_f0;
              this_00 = &local_f8;
              goto LAB_004866f7;
            }
          }
          else if ((uVar14 == 0x2000) &&
                  (((dVar7 = (double)(((in_RDX->d).d.ptr)->letterSpacing).val * 0.015625,
                    dVar16 = (double)((QFixed *)(local_48._0_8_ + 0x80))->val * 0.015625,
                    dVar7 != dVar16 || (NAN(dVar7) || NAN(dVar16))) ||
                   (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)))) {
            QVar20.m_data = (storage_type *)0xe;
            QVar20.m_size = (qsizetype)local_60;
            QString::fromUtf8(QVar20);
            QTextStream::operator<<(&(QVar8.stream)->ts,(QString *)local_60);
            if (local_60[0] != (QArrayData *)0x0) {
              LOCK();
              (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_60[0],2,0x10);
              }
            }
            if ((local_90.stream)->space == true) {
              QTextStream::operator<<(&(local_90.stream)->ts,' ');
            }
            QTextStream::operator<<
                      (&(local_90.stream)->ts,
                       (double)(((in_RDX->d).d.ptr)->letterSpacing).val * 0.015625);
            if ((local_90.stream)->space == true) {
              QTextStream::operator<<(&(local_90.stream)->ts,' ');
            }
            QVar8.stream = local_90.stream;
            (local_90.stream)->verbosity = 0;
            QVar21.m_data = (storage_type *)0x2;
            QVar21.m_size = (qsizetype)local_60;
            QString::fromUtf8(QVar21);
            QTextStream::operator<<(&(QVar8.stream)->ts,(QString *)local_60);
            if (local_60[0] != (QArrayData *)0x0) {
              LOCK();
              (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_60[0],2,0x10);
              }
            }
            if ((local_90.stream)->space == true) {
              QTextStream::operator<<(&(local_90.stream)->ts,' ');
            }
            local_108.stream = local_90.stream;
            (local_90.stream)->ref = (local_90.stream)->ref + 1;
            qt_QMetaEnum_debugOperator
                      ((QDebug *)&local_100,(longlong)&local_108,
                       (QMetaObject *)(ulong)((byte)((in_RDX->d).d.ptr)->field_0x7c >> 7),
                       (char *)&QFont::staticMetaObject);
            QVar8.stream = local_100.stream;
            QVar22.m_data = (storage_type *)0x1;
            QVar22.m_size = (qsizetype)local_60;
            QString::fromUtf8(QVar22);
            QTextStream::operator<<(&(QVar8.stream)->ts,(QString *)local_60);
            if (local_60[0] != (QArrayData *)0x0) {
              LOCK();
              (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_60[0],2,0x10);
              }
            }
            if ((local_100.stream)->space == true) {
              QTextStream::operator<<(&(local_100.stream)->ts,' ');
            }
            QDebug::~QDebug(&local_100);
            this_00 = &local_108;
            goto LAB_00486707;
          }
        }
        else if (uVar14 == 0x8000) {
          pQVar10 = (in_RDX->d).d.ptr;
          if ((((*(uint *)(local_48._0_8_ + 0x68) ^ *(uint *)&(pQVar10->request).field_0x60) &
               0xc0000000) != 0) ||
             (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
            (local_90.stream)->verbosity = 0;
            local_118.stream = local_90.stream;
            (local_90.stream)->ref = (local_90.stream)->ref + 1;
            pQVar11 = (QMetaObject *)(ulong)(*(uint *)&(pQVar10->request).field_0x60 >> 0x1e);
            this = &local_110;
            this_00 = &local_118;
            goto LAB_004866f7;
          }
        }
        else if (uVar14 == 0x10000) {
          pQVar10 = (in_RDX->d).d.ptr;
          pQVar2 = &((pQVar10->request).styleName.d.d)->super_QArrayData;
          pcVar12 = (pQVar10->request).styleName.d.ptr;
          lVar3 = (pQVar10->request).styleName.d.size;
          if (pQVar2 != (QArrayData *)0x0) {
            LOCK();
            (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pQVar4 = &((((QString *)(local_48._0_8_ + 0x20))->d).d)->super_QArrayData;
          psVar5 = *(char16_t **)(local_48._0_8_ + 0x28);
          lVar6 = *(qsizetype *)(local_48._0_8_ + 0x30);
          if (pQVar4 != (QArrayData *)0x0) {
            LOCK();
            (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if ((lVar3 == lVar6) &&
             (QVar25.m_data = pcVar12, QVar25.m_size = lVar3, QVar32.m_data = psVar5,
             QVar32.m_size = lVar3, cVar9 = QtPrivate::equalStrings(QVar25,QVar32), cVar9 != '\0'))
          {
            iVar1 = *(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4);
            if (pQVar4 != (QArrayData *)0x0) {
              LOCK();
              (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar4,2,0x10);
              }
            }
            if (pQVar2 != (QArrayData *)0x0) {
              LOCK();
              (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar2,2,0x10);
              }
            }
            if (iVar1 == 1) goto LAB_00486a0f;
          }
          else {
            if (pQVar4 != (QArrayData *)0x0) {
              LOCK();
              (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar4,2,0x10);
              }
            }
            if (pQVar2 != (QArrayData *)0x0) {
              LOCK();
              (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar2,2,0x10);
              }
            }
          }
          QVar8.stream = local_90.stream;
          QVar28.m_data = (storage_type *)0xa;
          QVar28.m_size = (qsizetype)local_60;
          QString::fromUtf8(QVar28);
          QTextStream::operator<<(&(QVar8.stream)->ts,(QString *)local_60);
          if (local_60[0] != (QArrayData *)0x0) {
            LOCK();
            (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_60[0],2,0x10);
            }
          }
          if ((local_90.stream)->space == true) {
            QTextStream::operator<<(&(local_90.stream)->ts,' ');
          }
          pQVar10 = (in_RDX->d).d.ptr;
          pQVar2 = &((pQVar10->request).styleName.d.d)->super_QArrayData;
          pcVar12 = (pQVar10->request).styleName.d.ptr;
          if (pQVar2 != (QArrayData *)0x0) {
            LOCK();
            (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if (pcVar12 == (char16_t *)0x0) {
            pcVar12 = (char16_t *)&QString::_empty;
          }
          QDebug::putString((QChar *)&local_90,(ulong)pcVar12);
          if ((local_90.stream)->space == true) {
            QTextStream::operator<<(&(local_90.stream)->ts,' ');
          }
          if (pQVar2 != (QArrayData *)0x0) {
            LOCK();
            (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar2,2,0x10);
            }
          }
          goto LAB_004869a0;
        }
LAB_00486a0f:
        QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_98);
      }
      QVar8.stream = local_90.stream;
      uVar14 = uVar14 * 2;
    } while ((int)uVar14 < 0xfffff);
    if (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) < 1) {
      QString::chop((longlong)&local_88);
    }
    else {
      (local_90.stream)->verbosity = 0;
      QVar31.m_data = &DAT_0000000c;
      QVar31.m_size = (qsizetype)local_60;
      QString::fromUtf8(QVar31);
      QTextStream::operator<<(&(QVar8.stream)->ts,(QString *)local_60);
      if (local_60[0] != (QArrayData *)0x0) {
        LOCK();
        (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_60[0],2,0x10);
        }
      }
      if ((local_90.stream)->space == true) {
        QTextStream::operator<<(&(local_90.stream)->ts,' ');
      }
      local_128.stream = local_90.stream;
      (local_90.stream)->ref = (local_90.stream)->ref + 1;
      qt_QMetaEnum_flagDebugOperator
                ((QDebug *)&local_120,(ulonglong)&local_128,
                 (QMetaObject *)(ulong)in_RDX->resolve_mask,(char *)&QFont::staticMetaObject);
      QDebug::~QDebug(&local_120);
      QDebug::~QDebug(&local_128);
    }
    pcVar12 = local_88.d.ptr;
    if (local_88.d.ptr == (char16_t *)0x0) {
      pcVar12 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)font,(ulong)pcVar12);
    pQVar10 = (font->d).d.ptr;
    if ((char)(pQVar10->request).styleName.d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar10,' ');
      pQVar10 = (font->d).d.ptr;
    }
    QTextStream::operator<<((QTextStream *)pQVar10,')');
    pQVar10 = (font->d).d.ptr;
    if ((char)(pQVar10->request).styleName.d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar10,' ');
      pQVar10 = (font->d).d.ptr;
    }
    (font->d).d.ptr = (QFontPrivate *)0x0;
    *(QFontPrivate **)stream.stream = pQVar10;
    QFont::~QFont((QFont *)local_48);
    QDebug::~QDebug(&local_90);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)stream.stream;
}

Assistant:

QDebug operator<<(QDebug stream, const QFont &font)
{
    QDebugStateSaver saver(stream);
    stream.nospace().noquote();
    stream << "QFont(";

    if (stream.verbosity() == QDebug::DefaultVerbosity) {
        stream << font.toString() << ")";
        return stream;
    }

    QString fontDescription;
    QDebug debug(&fontDescription);
    debug.nospace();

    const QFont defaultFont(new QFontPrivate);

    for (int property = QFont::SizeResolved; property < QFont::AllPropertiesResolved; property <<= 1) {
        const bool resolved = (font.resolve_mask & property) != 0;
        if (!resolved && stream.verbosity() == QDebug::MinimumVerbosity)
            continue;

        #define QFONT_DEBUG_SKIP_DEFAULT(prop) \
            if ((font.prop() == defaultFont.prop()) && stream.verbosity() == 1) \
                continue;

        QDebugStateSaver saver(debug);

        switch (property) {
        case QFont::SizeResolved:
            if (font.pointSizeF() >= 0)
                debug << font.pointSizeF() << "pt";
            else if (font.pixelSize() >= 0)
                debug << font.pixelSize() << "px";
            else
                Q_UNREACHABLE();
            break;
        case QFont::StyleHintResolved:
            QFONT_DEBUG_SKIP_DEFAULT(styleHint);
            debug.verbosity(1) << font.styleHint(); break;
        case QFont::StyleStrategyResolved:
            QFONT_DEBUG_SKIP_DEFAULT(styleStrategy);
            debug.verbosity(1) << font.styleStrategy(); break;
        case QFont::WeightResolved:
            debug.verbosity(1) << QFont::Weight(font.weight()); break;
        case QFont::StyleResolved:
            QFONT_DEBUG_SKIP_DEFAULT(style);
            debug.verbosity(0) << font.style(); break;
        case QFont::UnderlineResolved:
            QFONT_DEBUG_SKIP_DEFAULT(underline);
            debug << "underline=" << font.underline(); break;
        case QFont::OverlineResolved:
            QFONT_DEBUG_SKIP_DEFAULT(overline);
            debug << "overline=" << font.overline(); break;
        case QFont::StrikeOutResolved:
            QFONT_DEBUG_SKIP_DEFAULT(strikeOut);
            debug << "strikeOut=" << font.strikeOut(); break;
        case QFont::FixedPitchResolved:
            QFONT_DEBUG_SKIP_DEFAULT(fixedPitch);
            debug << "fixedPitch=" << font.fixedPitch(); break;
        case QFont::StretchResolved:
            QFONT_DEBUG_SKIP_DEFAULT(stretch);
            debug.verbosity(0) << QFont::Stretch(font.stretch()); break;
        case QFont::KerningResolved:
            QFONT_DEBUG_SKIP_DEFAULT(kerning);
            debug << "kerning=" << font.kerning(); break;
        case QFont::CapitalizationResolved:
            QFONT_DEBUG_SKIP_DEFAULT(capitalization);
            debug.verbosity(0) << font.capitalization(); break;
        case QFont::LetterSpacingResolved:
            QFONT_DEBUG_SKIP_DEFAULT(letterSpacing);
            debug << "letterSpacing=" << font.letterSpacing();
            debug.verbosity(0) << " (" << font.letterSpacingType() << ")";
            break;
        case QFont::HintingPreferenceResolved:
            QFONT_DEBUG_SKIP_DEFAULT(hintingPreference);
            debug.verbosity(0) << font.hintingPreference(); break;
        case QFont::StyleNameResolved:
            QFONT_DEBUG_SKIP_DEFAULT(styleName);
            debug << "styleName=" << font.styleName(); break;
        default:
            continue;
        };

        #undef QFONT_DEBUG_SKIP_DEFAULT

        debug << ", ";
    }

    if (stream.verbosity() > QDebug::MinimumVerbosity)
        debug.verbosity(0) << "resolveMask=" << QFlags<QFont::ResolveProperties>(font.resolve_mask);
    else
        fontDescription.chop(2); // Last ', '

    stream << fontDescription << ')';

    return stream;
}